

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wlcNtk.c
# Opt level: O2

Wlc_Ntk_t * Wlc_NtkDupDfs(Wlc_Ntk_t *p)

{
  Vec_Int_t *pVVar1;
  char *__s;
  int iVar2;
  Vec_Int_t *p_00;
  Wlc_Ntk_t *p_01;
  Wlc_Obj_t *pWVar3;
  Wlc_Obj_t *pObj;
  Vec_Int_t *pVVar4;
  int *__dest;
  char *__dest_00;
  int iVar5;
  size_t sVar6;
  
  Wlc_NtkCleanCopy(p);
  p_00 = Vec_IntAlloc(100);
  p_01 = Wlc_NtkAlloc(p->pName,p->nObjsAlloc);
  for (iVar5 = 0; iVar5 < (p->vCis).nSize; iVar5 = iVar5 + 1) {
    pWVar3 = Wlc_NtkCi(p,iVar5);
    Wlc_ObjDup(p_01,p,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar5 = 0; iVar2 = (p->vCos).nSize, iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pWVar3 = Wlc_NtkCo(p,iVar5);
    Wlc_NtkDupDfs_rec(p_01,p,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18),p_00);
  }
  for (iVar5 = 0; iVar5 < iVar2; iVar5 = iVar5 + 1) {
    pWVar3 = Wlc_NtkCo(p,iVar5);
    iVar2 = Vec_IntEntry(&p->vCopies,(int)(((long)pWVar3 - (long)p->pObjs) / 0x18));
    pObj = Wlc_NtkObj(p_01,iVar2);
    Wlc_ObjSetCo(p_01,pObj,*(uint *)pWVar3 >> 9 & 1);
    iVar2 = (p->vCos).nSize;
  }
  pVVar1 = p->vInits;
  if (pVVar1 != (Vec_Int_t *)0x0) {
    pVVar4 = (Vec_Int_t *)malloc(0x10);
    iVar5 = pVVar1->nSize;
    pVVar4->nSize = iVar5;
    pVVar4->nCap = iVar5;
    if ((long)iVar5 == 0) {
      sVar6 = 0;
      __dest = (int *)0x0;
    }
    else {
      sVar6 = (long)iVar5 << 2;
      __dest = (int *)malloc(sVar6);
    }
    pVVar4->pArray = __dest;
    memcpy(__dest,pVVar1->pArray,sVar6);
    p_01->vInits = pVVar4;
  }
  __s = p->pInits;
  if (__s != (char *)0x0) {
    sVar6 = strlen(__s);
    __dest_00 = (char *)malloc(sVar6 + 1);
    strcpy(__dest_00,__s);
    p_01->pInits = __dest_00;
  }
  Vec_IntFree(p_00);
  return p_01;
}

Assistant:

Wlc_Ntk_t * Wlc_NtkDupDfs( Wlc_Ntk_t * p )
{
    Wlc_Ntk_t * pNew;
    Wlc_Obj_t * pObj;
    Vec_Int_t * vFanins;
    int i;
    Wlc_NtkCleanCopy( p );
    vFanins = Vec_IntAlloc( 100 );
    pNew = Wlc_NtkAlloc( p->pName, p->nObjsAlloc );
    Wlc_NtkForEachCi( p, pObj, i )
        Wlc_ObjDup( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_NtkDupDfs_rec( pNew, p, Wlc_ObjId(p, pObj), vFanins );
    Wlc_NtkForEachCo( p, pObj, i )
        Wlc_ObjSetCo( pNew, Wlc_ObjCopyObj(pNew, p, pObj), pObj->fIsFi );
    if ( p->vInits )
    pNew->vInits = Vec_IntDup( p->vInits );
    if ( p->pInits )
    pNew->pInits = Abc_UtilStrsav( p->pInits );
    Vec_IntFree( vFanins );
    return pNew;
}